

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,AddressFormatData *network_parameter)

{
  NetType_conflict NVar1;
  string local_90;
  Script *local_70;
  TaprootScriptTree *local_68;
  Pubkey *local_60;
  ByteData *local_58;
  string *local_50;
  CfdSourceLocation local_48;
  
  this->type_ = type;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&local_90);
  local_50 = &this->address_;
  ByteData::ByteData(&this->hash_);
  local_60 = &this->pubkey_;
  local_58 = &this->hash_;
  Pubkey::Pubkey(local_60);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  local_68 = &this->script_tree_;
  TaprootScriptTree::TaprootScriptTree(local_68,tree);
  local_70 = &this->redeem_script_;
  Script::Script(local_70);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&this->format_data_,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)network_parameter);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  NVar1 = AddressFormatData::GetNetType(&this->format_data_);
  this->type_ = NVar1;
  TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&local_90,&tree->super_TapBranch,internal_pubkey,(bool *)0x0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             &local_90);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90);
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_90,network_parameter);
  CalculateTaproot(this,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x283;
  local_48.funcname = "Address";
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_90,network_parameter);
  logger::info<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string>
            (&local_48,"call Address({},{},{})",&this->type_,&this->addr_type_,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey,
    const AddressFormatData& network_parameter)
    : type_(type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_(),
      format_data_(network_parameter) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(network_parameter.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_,
      network_parameter.GetBech32Hrp());
}